

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_var_expression_t *expr)

{
  typed_var_expression_t *expr_00;
  expression_type_t eVar1;
  variable_id_t vVar2;
  ulong local_60 [4];
  allocator<char> local_39;
  string local_38;
  typed_var_expression_t *local_18;
  typed_var_expression_t *expr_local;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  local_18 = expr;
  expr_local = (typed_var_expression_t *)this;
  eVar1 = typed_expression_t::type((typed_expression_t *)expr);
  if (eVar1 != EXPR_TYPE_CLKVAR) {
    eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
    if (eVar1 != EXPR_TYPE_INTVAR) {
      eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
      if (eVar1 != EXPR_TYPE_LOCALINTVAR) {
        eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
        if (eVar1 != EXPR_TYPE_CLKARRAY) {
          eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
          if (eVar1 != EXPR_TYPE_INTARRAY) {
            eVar1 = typed_expression_t::type((typed_expression_t *)local_18);
            expr_00 = local_18;
            if (eVar1 != EXPR_TYPE_LOCALINTARRAY) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_38,"a variable",&local_39);
              invalid_expression(this,(typed_expression_t *)expr_00,&local_38);
              std::__cxx11::string::~string((string *)&local_38);
              std::allocator<char>::~allocator(&local_39);
            }
          }
        }
      }
    }
  }
  local_60[1] = 5;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)(local_60 + 1));
  vVar2 = typed_var_expression_t::id(local_18);
  local_60[0] = (ulong)vVar2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict2 *)local_60);
  return;
}

Assistant:

virtual void visit(tchecker::typed_var_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKVAR) && (expr.type() != tchecker::EXPR_TYPE_INTVAR) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTVAR) && (expr.type() != tchecker::EXPR_TYPE_CLKARRAY) &&
        (expr.type() != tchecker::EXPR_TYPE_INTARRAY) && (expr.type() != tchecker::EXPR_TYPE_LOCALINTARRAY))
      invalid_expression(expr, "a variable");

    // Write bytecode
    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = expr.id();
  }